

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O0

void __thiscall XPMP2::SocketNetworking::setBlocking(SocketNetworking *this,bool bBlock)

{
  byte bVar1;
  int iVar2;
  XPMP2Error *this_00;
  undefined8 uVar3;
  byte in_SIL;
  long in_RDI;
  int flags;
  uint local_94;
  undefined6 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff96;
  undefined1 uVar4;
  undefined1 in_stack_ffffffffffffff97;
  char *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  string *in_stack_ffffffffffffffe8;
  undefined7 in_stack_fffffffffffffff0;
  
  bVar1 = in_SIL & 1;
  if (*(int *)(in_RDI + 8) == -1) {
    this_00 = (XPMP2Error *)__cxa_allocate_exception(0x78);
    XPMP2Error::XPMP2Error
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/Network.cpp"
               ,0x248,"setBlocking","ASSERT FAILED: %s","f_socket != INVALID_SOCKET");
    __cxa_throw(this_00,&XPMP2Error::typeinfo,XPMP2Error::~XPMP2Error);
  }
  local_94 = fcntl(*(int *)(in_RDI + 8),3,0);
  if (local_94 == 0xffffffff) {
    uVar3 = __cxa_allocate_exception(0x50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
               (allocator<char> *)
               CONCAT17(in_stack_ffffffffffffff97,
                        CONCAT16(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90)));
    NetRuntimeError::NetRuntimeError
              ((NetRuntimeError *)CONCAT17(bVar1,in_stack_fffffffffffffff0),
               in_stack_ffffffffffffffe8);
    __cxa_throw(uVar3,&NetRuntimeError::typeinfo,NetRuntimeError::~NetRuntimeError);
  }
  if ((bVar1 & 1) == 0) {
    local_94 = local_94 | 0x800;
  }
  else {
    local_94 = local_94 & 0xfffff7ff;
  }
  iVar2 = fcntl(*(int *)(in_RDI + 8),4,(ulong)local_94);
  if (iVar2 < 0) {
    uVar4 = 1;
    uVar3 = __cxa_allocate_exception(0x50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
               (allocator<char> *)
               CONCAT17(in_stack_ffffffffffffff97,CONCAT16(uVar4,in_stack_ffffffffffffff90)));
    NetRuntimeError::NetRuntimeError
              ((NetRuntimeError *)CONCAT17(bVar1,in_stack_fffffffffffffff0),
               in_stack_ffffffffffffffe8);
    __cxa_throw(uVar3,&NetRuntimeError::typeinfo,NetRuntimeError::~NetRuntimeError);
  }
  return;
}

Assistant:

void SocketNetworking::setBlocking (bool bBlock)
{
    LOG_ASSERT(f_socket != INVALID_SOCKET);

 #if IBM
    unsigned long mode = bBlock ? 0 : 1;
    if (ioctlsocket(f_socket, FIONBIO, &mode) == SOCKET_ERROR)
        throw NetRuntimeError("ioctlsocket failed to set blocking flag");
 #else
    int flags = fcntl(f_socket, F_GETFL, 0);
    if (flags == -1)
        throw NetRuntimeError("fcntl failed to get flags");
    flags = bBlock ? (flags & ~O_NONBLOCK) : (flags | O_NONBLOCK);
    if (fcntl(f_socket, F_SETFL, flags) < 0)
        throw NetRuntimeError("fcntl failed to set blocking flag");
 #endif
}